

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::ComputeConstraintImpulsesRangeSpaceSparse
               (Model *model,VectorNd *Q,VectorNd *QDotMinus,ConstraintSet *CS,VectorNd *QDotPlus)

{
  VectorNd *in_stack_00000158;
  VectorNd *in_stack_00000160;
  VectorNd *in_stack_00000168;
  MatrixNd *in_stack_00000170;
  MatrixNd *in_stack_00000178;
  Model *in_stack_00000180;
  VectorNd *in_stack_00000190;
  MatrixNd *in_stack_00000198;
  VectorNd *in_stack_000001a0;
  LinearSolver in_stack_000001a8;
  VectorNd *in_stack_000003b8;
  VectorNd *in_stack_000003c0;
  VectorNd *in_stack_000003c8;
  Model *in_stack_000003d0;
  undefined1 in_stack_00000daf;
  MatrixNd *in_stack_00000db0;
  VectorNd *in_stack_00000db8;
  Model *in_stack_00000dc0;
  EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff50;
  MatrixNd *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  VectorNd *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar1;
  
  uVar1 = 0;
  UpdateKinematicsCustom(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003b8);
  CompositeRigidBodyAlgorithm
            (in_stack_00000dc0,in_stack_00000db8,in_stack_00000db0,(bool)in_stack_00000daf);
  CalcConstraintsJacobian
            ((Model *)CONCAT44(uVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,
             (ConstraintSet *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58,SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (in_stack_ffffffffffffff50,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff48);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
  ;
  SolveConstrainedSystemRangeSpaceSparse
            (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,
             in_stack_00000160,in_stack_00000158,in_stack_00000190,in_stack_00000198,
             in_stack_000001a0,in_stack_000001a8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6df9df);
  return;
}

Assistant:

RBDL_DLLAPI
void ComputeConstraintImpulsesRangeSpaceSparse (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDotMinus,
  ConstraintSet &CS,
  Math::VectorNd &QDotPlus
)
{

  // Compute H
  UpdateKinematicsCustom (model, &Q, NULL, NULL);
  CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

  // Compute G
  CalcConstraintsJacobian (model, Q, CS, CS.G, false);

  SolveConstrainedSystemRangeSpaceSparse (model, CS.H, CS.G, CS.H * QDotMinus
                                          , CS.v_plus, QDotPlus, CS.impulse, CS.K, CS.a, CS.linear_solver);

}